

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_utils.c
# Opt level: O0

int lookup_trace(char *chipset,char *event)

{
  int iVar1;
  trace *__ptr;
  ioctl_call *piVar2;
  undefined8 uVar3;
  char *pcVar4;
  ioctl_call *c;
  int i;
  trace *t;
  char *event_local;
  char *chipset_local;
  
  iVar1 = decode_trace(chipset,event);
  if (iVar1 == 0) {
    __ptr = parse_trace(event);
    if (__ptr == (trace *)0x0) {
      chipset_local._4_4_ = 1;
    }
    else {
      for (c._4_4_ = 0; c._4_4_ < __ptr->nb_ioctl; c._4_4_ = c._4_4_ + 1) {
        piVar2 = __ptr->ioctls + c._4_4_;
        uVar3 = 0x72;
        if ((piVar2->dir & 1U) != 0) {
          uVar3 = 0x77;
        }
        printf("(%c) register: %06x, value: %08x, mask: %08x ",uVar3,(ulong)piVar2->addr,
               (ulong)piVar2->value,(ulong)piVar2->mask);
        pcVar4 = "==>";
        if ((piVar2->dir & 1U) != 0) {
          pcVar4 = "<==";
        }
        printf("%s ",pcVar4);
        iVar1 = lookup(piVar2->addr,piVar2->value);
        if (iVar1 != 0) {
          fprintf(_stderr,"Failed to decode addr using lookup!\n");
          return 1;
        }
      }
      free(__ptr);
      chipset_local._4_4_ = 0;
    }
  }
  else {
    fprintf(_stderr,"Failed to decode trace using demmt!\n");
    chipset_local._4_4_ = 1;
  }
  return chipset_local._4_4_;
}

Assistant:

int
lookup_trace(const char *chipset, const char *event)
{
	struct trace *t;
	int i;

	if (decode_trace(chipset, event)) {
		fprintf(stderr, "Failed to decode trace using demmt!\n");
		return 1;
	}

	if (!(t = parse_trace(event)))
		return 1;

	for (i = 0; i < t->nb_ioctl; i++) {
		struct ioctl_call *c = &t->ioctls[i];

		printf("(%c) register: %06x, value: %08x, mask: %08x ",
		       (c->dir & 0x1 ? 'w' : 'r'), c->addr, c->value, c->mask);
		printf("%s ", (c->dir & 0x1 ? "<==" : "==>"));

		if (lookup(c->addr, c->value)) {
			fprintf(stderr, "Failed to decode addr using lookup!\n");
			return 1;
		}
	}
	free(t);

	return 0;
}